

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

bool __thiscall CCoinsViewCache::HaveInputs(CCoinsViewCache *this,CTransaction *tx)

{
  long lVar1;
  pointer pCVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = CTransaction::IsCoinBase(tx);
  bVar8 = true;
  if (!bVar3) {
    uVar7 = 0;
    do {
      pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pCVar2;
      uVar6 = lVar5 / 0x68;
      bVar8 = uVar6 <= uVar7;
      if (uVar6 <= uVar7) break;
      iVar4 = (*(this->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                        (this,pCVar2 + uVar7,lVar5 % 0x68);
      uVar7 = (ulong)((int)uVar7 + 1);
    } while ((char)iVar4 != '\0');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewCache::HaveInputs(const CTransaction& tx) const
{
    if (!tx.IsCoinBase()) {
        for (unsigned int i = 0; i < tx.vin.size(); i++) {
            if (!HaveCoin(tx.vin[i].prevout)) {
                return false;
            }
        }
    }
    return true;
}